

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void pnga_norm1(Integer g_a,double *nm)

{
  double dVar1;
  int iVar2;
  Integer IVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  double *pdVar7;
  double *pdVar8;
  float *pfVar9;
  float fVar10;
  double *pdVar11;
  double dVar12;
  double *pdVar13;
  long lVar14;
  char *string;
  double *pdVar15;
  float *pfVar16;
  double *pdVar17;
  long lVar18;
  double *pdVar19;
  double dVar20;
  long lVar21;
  bool bVar22;
  uint uVar23;
  ulong uVar24;
  float fVar25;
  float fsum;
  int isum;
  Integer type;
  char *ptr;
  double dsum;
  long lsum;
  Integer ld;
  Integer hi [2];
  Integer lo [2];
  double dval;
  Integer ndim;
  Integer dims [7];
  _iterator_hdl hdl;
  double *local_3f0;
  undefined1 local_3e8 [8];
  double *local_3e0;
  Integer local_3d8;
  float local_3d0 [2];
  double *local_3c8;
  double local_3c0;
  double local_3b8;
  long local_3b0;
  double local_3a8 [2];
  long local_398;
  long local_390;
  long local_388;
  long local_380;
  double local_378;
  long local_370;
  Integer local_368 [7];
  _iterator_hdl local_330;
  
  local_3d8 = 0;
  local_3e0 = nm;
  pnga_nodeid();
  pnga_nnodes();
  iVar2 = _ga_sync_end;
  local_3e8._4_4_ = 0;
  local_3b8 = 0.0;
  local_3c0 = 0.0;
  local_3e8._0_4_ = 0.0;
  local_3c8 = (double *)0x0;
  local_3a8[0] = 0.0;
  local_3a8[1] = 0.0;
  local_3d0[0] = 0.0;
  _ga_sync_end = 1;
  bVar22 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  if (bVar22) {
    pnga_sync();
  }
  pnga_check_handle(g_a,"ga_norm1_");
  pnga_inquire(g_a,&local_3d8,&local_370,local_368);
  if (local_370 - 3U < 0xfffffffffffffffe) {
    pnga_error("ga_norm1: wrong dimension",local_370);
  }
  switch(local_3d8) {
  case 0x3e9:
    local_3f0 = (double *)(local_3e8 + 4);
    break;
  case 0x3ea:
    local_3f0 = &local_3b8;
    break;
  case 0x3eb:
    local_3f0 = (double *)local_3e8;
    break;
  case 0x3ec:
    local_3f0 = &local_3c0;
    break;
  default:
    pnga_error("ga_norm1_: wrong data type:",local_3d8);
    local_3f0 = (double *)0x0;
    break;
  case 0x3ee:
    local_3f0 = (double *)local_3d0;
    break;
  case 0x3ef:
    local_3f0 = local_3a8;
  }
  pnga_local_iterator_init(g_a,&local_330);
  while (iVar5 = pnga_local_iterator_next
                           (&local_330,&local_388,&local_398,(char **)&local_3c8,&local_3b0),
        lVar14 = local_370, lVar4 = local_3b0, pdVar8 = local_3c8, IVar3 = local_3d8, iVar5 != 0) {
    lVar18 = local_3d8 + -0x3e9;
    switch(lVar18) {
    case 0:
      pdVar7 = (double *)0x0;
      pdVar11 = (double *)0x0;
      pdVar13 = (double *)0x0;
      pdVar15 = (double *)0x0;
      pdVar17 = (double *)0x0;
      pdVar19 = local_3f0;
      goto LAB_0012a7a0;
    case 1:
      pdVar7 = (double *)0x0;
      pdVar11 = (double *)0x0;
      pdVar13 = (double *)0x0;
      pdVar15 = (double *)0x0;
      pdVar17 = local_3f0;
      goto LAB_0012a79d;
    case 2:
      pdVar7 = (double *)0x0;
      pdVar11 = (double *)0x0;
      pdVar13 = local_3f0;
      goto LAB_0012a797;
    case 3:
      pdVar7 = (double *)0x0;
      pdVar11 = (double *)0x0;
      pdVar13 = (double *)0x0;
      pdVar15 = local_3f0;
      goto LAB_0012a79a;
    default:
      pnga_error("ga1_norm1_block: wrong data type:",local_3d8);
      pdVar7 = (double *)0x0;
      break;
    case 5:
      pdVar7 = local_3f0;
      break;
    case 6:
      pdVar7 = (double *)0x0;
      pdVar11 = local_3f0;
      goto LAB_0012a795;
    }
    pdVar11 = (double *)0x0;
LAB_0012a795:
    pdVar13 = (double *)0x0;
LAB_0012a797:
    pdVar15 = (double *)0x0;
LAB_0012a79a:
    pdVar17 = (double *)0x0;
LAB_0012a79d:
    pdVar19 = (double *)0x0;
LAB_0012a7a0:
    if (lVar14 < 1) {
LAB_0012a7bd:
      string = "sgai_norm1_block: wrong dimension";
      goto LAB_0012a7c7;
    }
    if (lVar14 == 1) {
      lVar6 = 1;
      lVar21 = 1;
    }
    else {
      lVar6 = local_380;
      lVar21 = local_390;
      if (lVar14 != 2) goto LAB_0012a7bd;
    }
    if (0 < lVar21 && 0 < local_398) {
      switch(lVar18) {
      case 0:
        *(undefined4 *)pdVar19 = 0;
        if (local_388 <= local_398) {
          iVar5 = 0;
          lVar14 = 0;
          do {
            pdVar7 = pdVar8;
            lVar18 = (lVar21 - lVar6) + 1;
            if (lVar6 <= lVar21) {
              do {
                fVar25 = *(float *)pdVar7;
                fVar10 = (float)-(int)fVar25;
                if (0 < (int)fVar25) {
                  fVar10 = fVar25;
                }
                iVar5 = iVar5 + (int)fVar10;
                *(int *)pdVar19 = iVar5;
                lVar18 = lVar18 + -1;
                pdVar7 = (double *)((long)pdVar7 + lVar4 * 4);
              } while (lVar18 != 0);
            }
            lVar14 = lVar14 + 1;
            pdVar8 = (double *)((long)pdVar8 + 4);
          } while (lVar14 != (local_398 - local_388) + 1);
        }
        break;
      case 1:
        *pdVar17 = 0.0;
        if (local_388 <= local_398) {
          dVar12 = 0.0;
          lVar14 = 0;
          do {
            pdVar7 = pdVar8;
            lVar18 = (lVar21 - lVar6) + 1;
            if (lVar6 <= lVar21) {
              do {
                dVar1 = *pdVar7;
                dVar20 = (double)-(long)dVar1;
                if (0 < (long)dVar1) {
                  dVar20 = dVar1;
                }
                dVar12 = (double)((long)dVar12 + (long)dVar20);
                *pdVar17 = dVar12;
                lVar18 = lVar18 + -1;
                pdVar7 = pdVar7 + lVar4;
              } while (lVar18 != 0);
            }
            lVar14 = lVar14 + 1;
            pdVar8 = pdVar8 + 1;
          } while (lVar14 != (local_398 - local_388) + 1);
        }
        break;
      case 2:
        *(undefined4 *)pdVar13 = 0;
        if (local_388 <= local_398) {
          fVar25 = 0.0;
          lVar14 = 0;
          do {
            pdVar7 = pdVar8;
            lVar18 = (lVar21 - lVar6) + 1;
            if (lVar6 <= lVar21) {
              do {
                fVar10 = *(float *)pdVar7;
                uVar23 = -(uint)(fVar10 < -fVar10);
                fVar25 = fVar25 + (float)(~uVar23 & (uint)fVar10 | (uint)-fVar10 & uVar23);
                *(float *)pdVar13 = fVar25;
                lVar18 = lVar18 + -1;
                pdVar7 = (double *)((long)pdVar7 + lVar4 * 4);
              } while (lVar18 != 0);
            }
            lVar14 = lVar14 + 1;
            pdVar8 = (double *)((long)pdVar8 + 4);
          } while (lVar14 != (local_398 - local_388) + 1);
        }
        break;
      case 3:
        *pdVar15 = 0.0;
        if (local_388 <= local_398) {
          dVar12 = 0.0;
          lVar14 = 0;
          do {
            if (lVar6 <= lVar21) {
              pdVar7 = pdVar8;
              lVar18 = (lVar21 - lVar6) + 1;
              do {
                dVar1 = *pdVar7;
                dVar20 = (double)((ulong)dVar1 ^ (ulong)DAT_001b2700);
                uVar24 = -(ulong)(dVar1 < dVar20);
                dVar12 = dVar12 + (double)(~uVar24 & (ulong)dVar1 | (ulong)dVar20 & uVar24);
                *pdVar15 = dVar12;
                pdVar7 = pdVar7 + lVar4;
                lVar18 = lVar18 + -1;
              } while (lVar18 != 0);
            }
            pdVar8 = pdVar8 + 1;
            bVar22 = lVar14 != local_398 - local_388;
            lVar14 = lVar14 + 1;
          } while (bVar22);
        }
        break;
      default:
        string = "sgai_norm1_block: wrong data type ";
        lVar14 = IVar3;
LAB_0012a7c7:
        pnga_error(string,lVar14);
        break;
      case 5:
        *pdVar7 = 0.0;
        if (local_388 <= local_398) {
          pfVar9 = (float *)((long)pdVar8 + 4);
          fVar25 = 0.0;
          lVar14 = 0;
          do {
            pfVar16 = pfVar9;
            lVar18 = (lVar21 - lVar6) + 1;
            if (lVar6 <= lVar21) {
              do {
                fVar25 = fVar25 + SQRT(pfVar16[-1] * pfVar16[-1] + *pfVar16 * *pfVar16);
                *(float *)pdVar7 = fVar25;
                lVar18 = lVar18 + -1;
                pfVar16 = pfVar16 + lVar4 * 2;
              } while (lVar18 != 0);
            }
            lVar14 = lVar14 + 1;
            pfVar9 = pfVar9 + 2;
          } while (lVar14 != (local_398 - local_388) + 1);
        }
        break;
      case 6:
        *pdVar11 = 0.0;
        pdVar11[1] = 0.0;
        if (local_388 <= local_398) {
          pdVar8 = pdVar8 + 1;
          dVar12 = 0.0;
          lVar14 = 0;
          do {
            pdVar7 = pdVar8;
            lVar18 = (lVar21 - lVar6) + 1;
            if (lVar6 <= lVar21) {
              do {
                dVar12 = dVar12 + SQRT(pdVar7[-1] * pdVar7[-1] + *pdVar7 * *pdVar7);
                *pdVar11 = dVar12;
                lVar18 = lVar18 + -1;
                pdVar7 = pdVar7 + lVar4 * 2;
              } while (lVar18 != 0);
            }
            lVar14 = lVar14 + 1;
            pdVar8 = pdVar8 + 2;
          } while (lVar14 != (local_398 - local_388) + 1);
        }
      }
    }
  }
  switch(local_3d8) {
  case 0x3e9:
    armci_msg_igop((int *)(local_3e8 + 4),1,"+");
    break;
  case 0x3ea:
    armci_msg_lgop((long *)&local_3b8,1,"+");
    break;
  case 0x3eb:
    armci_msg_fgop((float *)local_3e8,1,"+");
    break;
  case 0x3ec:
    armci_msg_dgop(&local_3c0,1,"+");
    break;
  default:
    pnga_error("ga_norm1_: wrong data type ",local_3d8);
    break;
  case 0x3ee:
    local_378 = (double)CONCAT44(local_378._4_4_,local_3d0[0]);
    armci_msg_fgop((float *)&local_378,1,"+");
    local_3d0[0] = local_378._0_4_;
    break;
  case 0x3ef:
    local_378 = local_3a8[0];
    armci_msg_dgop(&local_378,1,"+");
    local_3a8[0] = local_378;
  }
  switch(local_3d8) {
  case 0x3e9:
    dVar12 = (double)(int)local_3e8._4_4_;
    break;
  case 0x3ea:
    dVar12 = (double)(long)local_3b8;
    break;
  case 0x3eb:
    dVar12 = (double)(float)local_3e8._0_4_;
    break;
  case 0x3ec:
    dVar12 = local_3c0;
    break;
  default:
    pnga_error("ga_norm1_:wrong data type.",local_3d8);
    goto LAB_0012ac31;
  case 0x3ee:
    dVar12 = (double)local_3d0[0];
    break;
  case 0x3ef:
    dVar12 = local_3a8[0];
  }
  *local_3e0 = dVar12;
LAB_0012ac31:
  if (iVar2 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_norm1(Integer g_a, double *nm)
{
  Integer type=0;
  Integer me = pnga_nodeid (), i, j, nproc = pnga_nnodes();
  Integer ndim, dims[MAXDIM], lo[2], hi[2], ld; 
  Integer num_blocks_a;
  int local_sync_begin,local_sync_end;
  int isum = 0;
  long lsum = 0;
  double dsum = 0.0;
  float fsum = 0.0;
  double dval;
  float fval;
  DoubleComplex zsum;
  SingleComplex csum;
  char *buf = NULL;                    /*temporary buffer */
  char *ptr = NULL;
  zsum.real = 0.0;
  zsum.imag = 0.0;
  csum.real = 0.0;
  csum.imag = 0.0;
  _iterator_hdl hdl;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  pnga_check_handle (g_a, "ga_norm1_");

  pnga_inquire (g_a, &type, &ndim, dims);


  if(ndim<=0 || ndim > 2)
    pnga_error("ga_norm1: wrong dimension", ndim);

  switch (type)
  {
    case C_INT:
      buf = (void*)(&isum);
      break;
    case C_LONG:
      buf = (void*)(&lsum);
      break;
    case C_FLOAT:
      buf = (void*)(&fsum);
      break;
    case C_DBL:
      buf = (void*)(&dsum);
      break;
    case C_DCPL:
      buf = (void*)(&zsum);
      break;
    case C_SCPL:
      buf = (void*)(&csum);
      break;
    default:
      pnga_error("ga_norm1_: wrong data type:", type);
  }

#if 1
  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl,lo,hi,&ptr,&ld)) {
    sgai_norm1_block(g_a, ptr, lo, hi, ld, type, ndim, dims, buf);
  }
#else
  num_blocks_a = pnga_total_blocks(g_a);

  if (num_blocks_a < 0) {
    pnga_distribution(g_a, me, lo, hi);
    pnga_access_ptr(g_a, lo, hi, &ptr, &ld);
    sgai_norm1_block(g_a, ptr, lo, hi, ld, type, ndim, dims, buf);
    pnga_release_update(g_a, lo, hi);
  } else {
    Integer idx;
    /* Simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)) {
      for (idx = me; idx < num_blocks_a; idx += nproc) {
        pnga_distribution(g_a, idx, lo, hi);
        pnga_access_block_ptr(g_a, idx, &ptr, &ld);
        sgai_norm1_block(g_a, ptr, lo, hi, ld, type, ndim, dims, buf);
        pnga_release_update_block(g_a, idx);
      }
    } else {
      /* Uses scalapack block-cyclic data distribution */
      Integer chk;
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);
      while (index[ndim-1] < blocks[ndim-1]) {
        /* find bounding coordinates of block */
        chk = 1;
        for (i = 0; i < ndim; i++) {
          lo[i] = index[i]*block_dims[i]+1;
          hi[i] = (index[i] + 1)*block_dims[i];
          if (hi[i] > dims[i]) hi[i] = dims[i];
          if (hi[i] < lo[i]) chk = 0;
        }
        if (chk) {
          pnga_access_block_grid_ptr(g_a, index, &ptr, &ld);
          sgai_norm1_block(g_a, ptr, lo, hi, ld, type, ndim, dims, buf);
          pnga_release_update_block_grid(g_a, index);
        }
        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < ndim; i++) {
          if (index[i] >= blocks[i] && i<ndim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }
  }
#endif

  /*calculate the global value buf[j] for each column */
  switch (type)
  {
    case C_INT:
      armci_msg_igop (&isum, 1, "+");
      break;
    case C_DBL:
      armci_msg_dgop (&dsum, 1, "+");
      break;
    case C_DCPL:
      dval = zsum.real;
      armci_msg_dgop (&dval, 1, "+");
      zsum.real = dval;
      break;
    case C_FLOAT:
      armci_msg_fgop (&fsum, 1, "+");
      break;
    case C_SCPL:
      fval = csum.real;
      armci_msg_fgop (&fval, 1, "+");
      csum.real = fval;
      break;
    case C_LONG:
      armci_msg_lgop (&lsum, 1, "+");
      break;
    default:
      pnga_error("ga_norm1_: wrong data type ", type);
  }

  /*evaluate the norm1 for the matrix g_a */
  switch (type)
  {
    case C_INT:
      *nm = (double)isum;
      break;
    case C_LONG:
      *nm = (double)lsum;
      break;
    case C_FLOAT:
      *nm = (double)fsum;
      break;
    case C_DBL:
      *nm = (double)dsum;
      break;
    case C_DCPL:
      *nm = (double)(zsum.real);
      break;
    case C_SCPL:
      *nm = (double)(csum.real);
      break;
    default:
      pnga_error("ga_norm1_:wrong data type.", type);
  }

  if(local_sync_end)pnga_sync();
}